

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

WalletDescriptor * __thiscall
wallet::DescriptorScriptPubKeyMan::GetWalletDescriptor
          (WalletDescriptor *__return_storage_ptr__,DescriptorScriptPubKeyMan *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  int32_t iVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->m_wallet_descriptor).descriptor.
           super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->m_wallet_descriptor).descriptor.
           super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->next_index = (this->m_wallet_descriptor).next_index;
  uVar3 = *(undefined8 *)(this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems;
  uVar4 = *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined8 *)
           ((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar6 = *(undefined8 *)
           ((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x18);
  iVar7 = (this->m_wallet_descriptor).range_start;
  iVar8 = (this->m_wallet_descriptor).range_end;
  __return_storage_ptr__->creation_time = (this->m_wallet_descriptor).creation_time;
  __return_storage_ptr__->range_start = iVar7;
  __return_storage_ptr__->range_end = iVar8;
  *(undefined8 *)((__return_storage_ptr__->id).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar5
  ;
  *(undefined8 *)((__return_storage_ptr__->id).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6
  ;
  *(undefined8 *)(__return_storage_ptr__->id).super_base_blob<256U>.m_data._M_elems = uVar3;
  *(undefined8 *)((__return_storage_ptr__->id).super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  DescriptorCache::DescriptorCache
            (&__return_storage_ptr__->cache,&(this->m_wallet_descriptor).cache);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

WalletDescriptor DescriptorScriptPubKeyMan::GetWalletDescriptor() const
{
    return m_wallet_descriptor;
}